

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

Box * amrex::FabArrayBase::CFinfo::Domain
                (Geometry *geom,IntVect *ng,bool include_periodic,bool include_physbndry)

{
  bool bVar1;
  Box *pBVar2;
  byte in_CL;
  long in_RDX;
  Geometry *in_RSI;
  Box *in_RDI;
  byte in_R8B;
  Box *bx;
  int idim;
  int local_38;
  
  pBVar2 = Geometry::Domain(in_RSI);
  *(undefined8 *)(in_RDI->smallend).vect = *(undefined8 *)(pBVar2->smallend).vect;
  *(undefined8 *)((in_RDI->smallend).vect + 2) = *(undefined8 *)((pBVar2->smallend).vect + 2);
  *(undefined8 *)((in_RDI->bigend).vect + 1) = *(undefined8 *)((pBVar2->bigend).vect + 1);
  (in_RDI->btype).itype = (pBVar2->btype).itype;
  for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
    bVar1 = Geometry::isPeriodic(in_RSI,local_38);
    if (bVar1) {
      if ((in_CL & 1) != 0) {
        Box::grow(in_RDI,local_38,*(int *)(in_RDX + (long)local_38 * 4));
      }
    }
    else if ((in_R8B & 1) != 0) {
      Box::grow(in_RDI,local_38,*(int *)(in_RDX + (long)local_38 * 4));
    }
  }
  return in_RDI;
}

Assistant:

Box
FabArrayBase::CFinfo::Domain (const Geometry& geom, const IntVect& ng,
                              bool include_periodic, bool include_physbndry)
{
    Box bx = geom.Domain();
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            if (include_periodic) {
                bx.grow(idim, ng[idim]);
            }
        } else {
            if (include_physbndry) {
                bx.grow(idim, ng[idim]);
            }
        }
    }
    return bx;
}